

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<capnproto_test::capnp::test::TestInterface::Server*&>
          (String *__return_storage_ptr__,kj *this,Server **params)

{
  kj *this_00;
  Server **value;
  CappedArray<char,_17UL> *params_00;
  CappedArray<char,_17UL> local_38;
  kj *local_18;
  Server **params_local;
  
  local_18 = this;
  params_local = (Server **)__return_storage_ptr__;
  this_00 = (kj *)fwd<capnproto_test::capnp::test::TestInterface::Server*&>((Server **)this);
  toCharSequence<capnproto_test::capnp::test::TestInterface::Server*&>(&local_38,this_00,value);
  _::concat<kj::CappedArray<char,17ul>>(__return_storage_ptr__,(_ *)&local_38,params_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}